

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

Stmt * __thiscall kratos::Stmt::stmt_parent(Stmt *this)

{
  int iVar1;
  Stmt *pSVar2;
  undefined4 extraout_var;
  Stmt *pSVar3;
  uint32_t i;
  uint uVar4;
  
  uVar4 = 0;
  pSVar3 = (Stmt *)this->parent_;
  while (((pSVar2 = pSVar3, uVar4 < 100000 && (pSVar2 != (Stmt *)0x0)) &&
         ((pSVar2->super_IRNode).ast_node_type_ == StmtKind))) {
    iVar1 = (*(pSVar2->super_IRNode)._vptr_IRNode[4])(pSVar2);
    uVar4 = uVar4 + 1;
    this = pSVar2;
    pSVar3 = (Stmt *)CONCAT44(extraout_var,iVar1);
  }
  pSVar3 = (Stmt *)__dynamic_cast(this,&IRNode::typeinfo,&typeinfo,0);
  return pSVar3;
}

Assistant:

Stmt *Stmt::stmt_parent() const {
    const IRNode *p = parent_;
    const IRNode *pre = this;
    for (uint32_t i = 0; i < 100000u && p; i++) {
        if (p->ir_node_kind() == IRNodeKind::StmtKind) {
            pre = p;
            p = p->parent();
        } else {
            break;
        }
    }
    return dynamic_cast<Stmt *>(const_cast<IRNode *>(pre));
}